

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int iVar6;
  char flag;
  allocator local_21d;
  int local_21c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char buffer [256];
  
  do {
    sVar3 = read(this->read_fd_,&flag,1);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (iVar1 == 0) {
        this->outcome_ = DIED;
        goto LAB_00128759;
      }
      if (iVar1 == 1) {
        if (flag == 'I') {
          iVar1 = this->read_fd_;
          Message::Message((Message *)&local_218);
          goto LAB_00128882;
        }
        if (flag == 'L') {
          this->outcome_ = LIVED;
          goto LAB_00128759;
        }
        if (flag == 'T') {
          this->outcome_ = THREW;
          goto LAB_00128759;
        }
        if (flag != 'R') {
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer;
          GTestLog::GTestLog((GTestLog *)this_00,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                             ,0x1ea);
          poVar5 = std::operator<<((ostream *)&std::cerr,"Death test child process reported ");
          poVar5 = std::operator<<(poVar5,"unexpected status byte (");
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
          std::operator<<(poVar5,")");
          goto LAB_00128748;
        }
        this->outcome_ = RETURNED;
        goto LAB_00128759;
      }
      break;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  this_00 = &local_1f8;
  GTestLog::GTestLog((GTestLog *)this_00,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                     ,0x1ef);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Read from death test child process failed: ");
  GetLastErrnoDescription_abi_cxx11_();
  std::operator<<(poVar5,(string *)buffer);
  std::__cxx11::string::_M_dispose();
LAB_00128748:
  GTestLog::~GTestLog((GTestLog *)this_00);
  goto LAB_00128759;
  while( true ) {
    piVar4 = __errno_location();
    iVar6 = *piVar4;
    if (iVar6 != 4) break;
LAB_00128882:
    while( true ) {
      sVar3 = read(iVar1,buffer,0xff);
      uVar2 = (uint)sVar3;
      if ((int)uVar2 < 1) break;
      buffer[uVar2 & 0x7fffffff] = '\0';
      std::operator<<((ostream *)(local_218._M_dataplus._M_p + 0x10),buffer);
    }
    if (uVar2 != 0xffffffff) {
      if (uVar2 == 0) {
        GTestLog::GTestLog((GTestLog *)&local_1d8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                           ,0x167);
        StringStreamToString(&local_1f8,(stringstream *)local_218._M_dataplus._M_p);
        std::operator<<((ostream *)&std::cerr,(string *)&local_1f8);
        goto LAB_001289f5;
      }
      piVar4 = __errno_location();
      iVar6 = *piVar4;
      break;
    }
  }
  GTestLog::GTestLog((GTestLog *)&local_1d8,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                     ,0x16a);
  poVar5 = std::operator<<((ostream *)&std::cerr,"Error while reading death test internal: ");
  GetLastErrnoDescription_abi_cxx11_();
  poVar5 = std::operator<<(poVar5,(string *)&local_1f8);
  poVar5 = std::operator<<(poVar5," [");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
  std::operator<<(poVar5,"]");
LAB_001289f5:
  std::__cxx11::string::_M_dispose();
  GTestLog::~GTestLog((GTestLog *)&local_1d8);
  if ((stringstream *)local_218._M_dataplus._M_p != (stringstream *)0x0) {
    (**(code **)(*(long *)local_218._M_dataplus._M_p + 8))();
  }
LAB_00128759:
  do {
    iVar1 = close(this->read_fd_);
    if (iVar1 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  std::__cxx11::string::string((string *)&local_198,"CHECK failed: File ",&local_21d);
  std::operator+(&local_178,&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_158,&local_178,", line ");
  local_21c = 0x1f2;
  StreamableToString<int>(&local_1b8,&local_21c);
  std::operator+(&local_1d8,&local_158,&local_1b8);
  std::operator+(&local_218,&local_1d8,": ");
  std::operator+(&local_1f8,&local_218,"posix::Close(read_fd())");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                 &local_1f8," != -1");
  DeathTestAbort((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}